

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O0

mbedtls_pk_type_t mbedtls_ssl_get_ciphersuite_sig_alg(mbedtls_ssl_ciphersuite_t *info)

{
  mbedtls_ssl_ciphersuite_t *info_local;
  
  if (info->key_exchange - 2 < 2) {
    info_local._4_4_ = MBEDTLS_PK_RSA;
  }
  else if (info->key_exchange == 4) {
    info_local._4_4_ = MBEDTLS_PK_ECDSA;
  }
  else {
    info_local._4_4_ = MBEDTLS_PK_NONE;
  }
  return info_local._4_4_;
}

Assistant:

mbedtls_pk_type_t mbedtls_ssl_get_ciphersuite_sig_alg(const mbedtls_ssl_ciphersuite_t *info)
{
    switch (info->key_exchange) {
        case MBEDTLS_KEY_EXCHANGE_DHE_RSA:
        case MBEDTLS_KEY_EXCHANGE_ECDHE_RSA:
            return MBEDTLS_PK_RSA;

        case MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA:
            return MBEDTLS_PK_ECDSA;

        default:
            return MBEDTLS_PK_NONE;
    }
}